

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O3

ExtractResult
absl::lts_20250127::cord_internal::CordRepBtree::ExtractAppendBuffer
          (CordRepBtree *tree,size_t extra_capacity)

{
  uint8_t uVar1;
  size_t sVar2;
  byte bVar3;
  sbyte sVar4;
  sbyte sVar5;
  int iVar6;
  CordRep *pCVar7;
  CordRepBtree *pCVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ExtractResult EVar12;
  NodeStack stack;
  long lStack_98;
  code *apcStack_90 [13];
  
  pCVar7 = (CordRep *)0x0;
  lVar10 = 0;
  pCVar8 = tree;
  do {
    iVar9 = (pCVar8->super_CordRep).refcount.count_.super___atomic_base<int>._M_i;
    if ((pCVar8->super_CordRep).storage[0] == '\0') {
      if (((iVar9 == 2) &&
          (pCVar7 = *(CordRep **)
                     ((pCVar8->super_CordRep).storage +
                     (ulong)(pCVar8->super_CordRep).storage[2] * 8 + -5), 5 < pCVar7->tag)) &&
         ((pCVar7->refcount).count_.super___atomic_base<int>._M_i == 2)) {
        bVar3 = pCVar7->tag;
        if ((bVar3 - 0xf9 < 7) || (bVar3 < 6)) {
          apcStack_90[0] = anon_unknown_0::DumpAll::anon_class_16_2_6856332a::operator();
          __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                        ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
        }
        sVar5 = 0xc;
        if (bVar3 < 0xbb) {
          sVar5 = 6;
        }
        iVar9 = -0xb800d;
        if (bVar3 < 0xbb) {
          iVar9 = -0xe8d;
        }
        sVar4 = 3;
        if (0x42 < bVar3) {
          sVar4 = sVar5;
        }
        sVar2 = pCVar7->length;
        iVar6 = -0x1d;
        if (0x42 < bVar3) {
          iVar6 = iVar9;
        }
        if (extra_capacity <= (long)(int)(((uint)bVar3 << sVar4) + iVar6) - sVar2) {
          bVar3 = (pCVar8->super_CordRep).storage[2];
          if ((ulong)bVar3 - (ulong)(pCVar8->super_CordRep).storage[1] != 1) goto LAB_0036e162;
          goto LAB_0036e137;
        }
      }
      pCVar7 = (CordRep *)0x0;
      goto LAB_0036e10d;
    }
    if (iVar9 != 2) goto LAB_0036e10d;
    apcStack_90[lVar10 + 1] = (code *)pCVar8;
    lVar10 = lVar10 + 1;
    pCVar8 = *(CordRepBtree **)
              ((pCVar8->super_CordRep).storage + (ulong)(pCVar8->super_CordRep).storage[2] * 8 + -5)
    ;
  } while ((pCVar8->super_CordRep).tag == '\x03');
  goto LAB_0036e072;
  while( true ) {
    pCVar8 = (CordRepBtree *)apcStack_90[lVar10];
    lVar10 = lVar10 + -1;
    bVar3 = (pCVar8->super_CordRep).storage[2];
    if ((ulong)bVar3 - (ulong)(pCVar8->super_CordRep).storage[1] != 1) break;
LAB_0036e137:
    apcStack_90[0] = (code *)0x36e141;
    operator_delete(pCVar8,0x40);
    tree = (CordRepBtree *)0x0;
    if (lVar10 < 1) goto LAB_0036e10d;
  }
LAB_0036e162:
  (pCVar8->super_CordRep).storage[2] = bVar3 - 1;
  (pCVar8->super_CordRep).length = (pCVar8->super_CordRep).length - sVar2;
  if (0 < (int)(uint)lVar10) {
    uVar11 = (ulong)((uint)lVar10 & 0x7fffffff) + 1;
    do {
      pCVar8 = (CordRepBtree *)(&lStack_98)[uVar11];
      (pCVar8->super_CordRep).length = (pCVar8->super_CordRep).length - sVar2;
      uVar11 = uVar11 - 1;
    } while (1 < uVar11);
  }
  do {
    uVar11 = (ulong)(pCVar8->super_CordRep).storage[2];
    tree = pCVar8;
    if (uVar11 - (pCVar8->super_CordRep).storage[1] != 1) {
LAB_0036e10d:
      EVar12.extracted = pCVar7;
      EVar12.tree = &tree->super_CordRep;
      return EVar12;
    }
    tree = *(CordRepBtree **)((pCVar8->super_CordRep).storage + uVar11 * 8 + -5);
    uVar1 = (pCVar8->super_CordRep).storage[0];
    apcStack_90[0] = (code *)0x36e1bd;
    operator_delete(pCVar8,0x40);
    if (uVar1 == '\0') goto LAB_0036e10d;
    pCVar8 = tree;
  } while ((tree->super_CordRep).tag == '\x03');
LAB_0036e072:
  apcStack_90[0] = (code *)0x36e091;
  __assert_fail("IsBtree()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
}

Assistant:

CordRepBtree::ExtractResult CordRepBtree::ExtractAppendBuffer(
    CordRepBtree* tree, size_t extra_capacity) {
  int depth = 0;
  NodeStack stack;

  // Set up default 'no success' result which is {tree, nullptr}.
  ExtractResult result;
  result.tree = tree;
  result.extracted = nullptr;

  // Dive down the right side of the tree, making sure no edges are shared.
  while (tree->height() > 0) {
    if (!tree->refcount.IsOne()) return result;
    stack[depth++] = tree;
    tree = tree->Edge(kBack)->btree();
  }
  if (!tree->refcount.IsOne()) return result;

  // Validate we ended on a non shared flat.
  CordRep* rep = tree->Edge(kBack);
  if (!(rep->IsFlat() && rep->refcount.IsOne())) return result;

  // Verify it has at least the requested extra capacity.
  CordRepFlat* flat = rep->flat();
  const size_t length = flat->length;
  const size_t avail = flat->Capacity() - flat->length;
  if (extra_capacity > avail) return result;

  // Set the extracted flat in the result.
  result.extracted = flat;

  // Cascading delete all nodes that become empty.
  while (tree->size() == 1) {
    CordRepBtree::Delete(tree);
    if (--depth < 0) {
      // We consumed the entire tree: return nullptr for new tree.
      result.tree = nullptr;
      return result;
    }
    rep = tree;
    tree = stack[depth];
  }

  // Remove the edge or cascaded up parent node.
  tree->set_end(tree->end() - 1);
  tree->length -= length;

  // Adjust lengths up the tree.
  while (depth > 0) {
    tree = stack[--depth];
    tree->length -= length;
  }

  // Remove unnecessary top nodes with size = 1. This may iterate all the way
  // down to the leaf node in which case we simply return the remaining last
  // edge in that node and the extracted flat.
  while (tree->size() == 1) {
    int height = tree->height();
    rep = tree->Edge(kBack);
    Delete(tree);
    if (height == 0) {
      // We consumed the leaf: return the sole data edge as the new tree.
      result.tree = rep;
      return result;
    }
    tree = rep->btree();
  }

  // Done: return the (new) top level node and extracted flat.
  result.tree = tree;
  return result;
}